

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<std::complex<float>_>::TimesBetaPlusZ
          (TPZFMatrix<std::complex<float>_> *this,complex<float> beta,
          TPZFMatrix<std::complex<float>_> *z)

{
  complex<float> *__z;
  long in_RDI;
  complex<float> *pz;
  complex<float> *ptlast;
  complex<float> *pt;
  complex<float> *this_00;
  
  this_00 = *(complex<float> **)(in_RDI + 0x20);
  __z = (complex<float> *)
        (*(long *)(in_RDI + 0x20) + *(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10) * 8);
  while (this_00 < __z) {
    std::complex<float>::operator*=(ptlast,pz);
    this_00 = this_00 + 1;
    std::complex<float>::operator+=(this_00,__z);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::TimesBetaPlusZ(const TVar beta,const TPZFMatrix<TVar> &z) {
    // #ifdef USING_ATLAS
    // 	int size = fRow*fCol;
    // 	cblas_dscal(size,beta,fElem,1);
    // 	cblas_daxpy(size,1.,z.fElem,1,fElem,1);
    // #else
    
    TVar * pt = fElem,  *ptlast = fElem + this->fRow*this->fCol;
    TVar * pz = z.fElem;
    //	while(pt < ptlast) *pt++ *= (beta) + *pz++;
    while(pt < ptlast) {
        *pt *= (beta);
        *pt++ += *pz++;
    }
    // #endif
}